

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_queue.cpp
# Opt level: O0

uint32_t __thiscall
cppnet::BufferQueue::Write(BufferQueue *this,shared_ptr<cppnet::InnerBuffer> *buffer,uint32_t len)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined4 uVar1;
  bool bVar2;
  uint uVar3;
  element_type *peVar4;
  element_type *peVar5;
  element_type *peVar6;
  undefined1 local_108 [32];
  undefined1 local_e8 [32];
  undefined1 local_c8 [32];
  undefined1 local_a8 [24];
  uint32_t cur_write_len;
  uint32_t total_write_len;
  uint local_80;
  uint32_t should_write_size;
  undefined1 local_70 [8];
  shared_ptr<cppnet::BufferBlock> from_buffer;
  List<cppnet::BufferBlock> from_list;
  shared_ptr<cppnet::BufferQueue> buffer_queue;
  uint32_t len_local;
  shared_ptr<cppnet::InnerBuffer> *buffer_local;
  BufferQueue *this_local;
  
  bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)buffer);
  if (bVar2) {
    buffer_queue.super___shared_ptr<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi._4_4_ = len;
    if (len == 0) {
      peVar4 = std::
               __shared_ptr_access<cppnet::InnerBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<cppnet::InnerBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)buffer);
      buffer_queue.super___shared_ptr<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi._4_4_ = (*(peVar4->super_Buffer)._vptr_Buffer[8])();
    }
    if (buffer_queue.super___shared_ptr<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi._4_4_ == 0) {
      this_local._4_4_ = 0;
    }
    else {
      this_00 = &from_list._tail.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount;
      std::dynamic_pointer_cast<cppnet::BufferQueue,cppnet::InnerBuffer>
                ((shared_ptr<cppnet::InnerBuffer> *)this_00);
      peVar5 = std::
               __shared_ptr_access<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this_00);
      List<cppnet::BufferBlock>::List
                ((List<cppnet::BufferBlock> *)
                 &from_buffer.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,&peVar5->_buffer_list);
      List<cppnet::BufferBlock>::GetHead((List<cppnet::BufferBlock> *)local_70);
      List<cppnet::BufferBlock>::GetHead((List<cppnet::BufferBlock> *)&cur_write_len);
      peVar6 = std::
               __shared_ptr_access<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&cur_write_len);
      uVar3 = (*(peVar6->super_InnerBuffer).super_Buffer._vptr_Buffer[8])();
      std::shared_ptr<cppnet::BufferBlock>::~shared_ptr
                ((shared_ptr<cppnet::BufferBlock> *)&cur_write_len);
      local_a8._20_4_ = 0;
      local_a8._16_4_ = 0;
      local_80 = uVar3;
      do {
        bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->_buffer_write);
        if (!bVar2) {
          (*(this->super_InnerBuffer).super_Buffer._vptr_Buffer[0x13])();
          List<cppnet::BufferBlock>::GetTail((List<cppnet::BufferBlock> *)local_a8);
          std::shared_ptr<cppnet::BufferBlock>::operator=
                    (&this->_buffer_write,(shared_ptr<cppnet::BufferBlock> *)local_a8);
          std::shared_ptr<cppnet::BufferBlock>::~shared_ptr
                    ((shared_ptr<cppnet::BufferBlock> *)local_a8);
        }
        peVar6 = std::
                 __shared_ptr_access<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&this->_buffer_write);
        std::shared_ptr<cppnet::InnerBuffer>::shared_ptr<cppnet::BufferBlock,void>
                  ((shared_ptr<cppnet::InnerBuffer> *)(local_c8 + 0x10),
                   (shared_ptr<cppnet::BufferBlock> *)local_70);
        local_a8._16_4_ =
             (*(peVar6->super_InnerBuffer).super_Buffer._vptr_Buffer[0xd])
                       (peVar6,(shared_ptr<cppnet::InnerBuffer> *)(local_c8 + 0x10),(ulong)local_80)
        ;
        std::shared_ptr<cppnet::InnerBuffer>::~shared_ptr
                  ((shared_ptr<cppnet::InnerBuffer> *)(local_c8 + 0x10));
        local_a8._20_4_ = local_a8._16_4_ + local_a8._20_4_;
        if ((uint)local_a8._16_4_ < local_80) {
          if (buffer_queue.super___shared_ptr<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi._4_4_ <= (uint)local_a8._20_4_) break;
          local_80 = local_80 - local_a8._16_4_;
          std::__shared_ptr_access<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)&this->_buffer_write);
          ListSlot<cppnet::BufferBlock>::GetNext((ListSlot<cppnet::BufferBlock> *)local_108);
          std::shared_ptr<cppnet::BufferBlock>::operator=
                    (&this->_buffer_write,(shared_ptr<cppnet::BufferBlock> *)local_108);
          std::shared_ptr<cppnet::BufferBlock>::~shared_ptr
                    ((shared_ptr<cppnet::BufferBlock> *)local_108);
        }
        else {
          peVar5 = std::
                   __shared_ptr_access<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&from_list._tail.
                                    super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount);
          bVar2 = std::operator==((shared_ptr<cppnet::BufferBlock> *)local_70,&peVar5->_buffer_write
                                 );
          if (bVar2) {
            peVar5 = std::
                     __shared_ptr_access<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)&from_list._tail.
                                      super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount);
            std::__shared_ptr_access<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&peVar5->_buffer_write);
            ListSlot<cppnet::BufferBlock>::GetNext((ListSlot<cppnet::BufferBlock> *)local_c8);
            bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_c8);
            std::shared_ptr<cppnet::BufferBlock>::~shared_ptr
                      ((shared_ptr<cppnet::BufferBlock> *)local_c8);
            if (!bVar2) {
              peVar5 = std::
                       __shared_ptr_access<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)&from_list._tail.
                                        super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount);
              (*(peVar5->super_InnerBuffer).super_Buffer._vptr_Buffer[0x12])();
              break;
            }
            peVar5 = std::
                     __shared_ptr_access<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)&from_list._tail.
                                      super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount);
            std::__shared_ptr_access<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&peVar5->_buffer_write);
            ListSlot<cppnet::BufferBlock>::GetNext
                      ((ListSlot<cppnet::BufferBlock> *)(local_e8 + 0x10));
            peVar5 = std::
                     __shared_ptr_access<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)&from_list._tail.
                                      super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount);
            std::shared_ptr<cppnet::BufferBlock>::operator=
                      (&peVar5->_buffer_write,(shared_ptr<cppnet::BufferBlock> *)(local_e8 + 0x10));
            std::shared_ptr<cppnet::BufferBlock>::~shared_ptr
                      ((shared_ptr<cppnet::BufferBlock> *)(local_e8 + 0x10));
          }
          List<cppnet::BufferBlock>::PopFront((List<cppnet::BufferBlock> *)local_e8);
          std::shared_ptr<cppnet::BufferBlock>::~shared_ptr
                    ((shared_ptr<cppnet::BufferBlock> *)local_e8);
          List<cppnet::BufferBlock>::GetHead((List<cppnet::BufferBlock> *)(local_108 + 0x10));
          std::shared_ptr<cppnet::BufferBlock>::operator=
                    ((shared_ptr<cppnet::BufferBlock> *)local_70,
                     (shared_ptr<cppnet::BufferBlock> *)(local_108 + 0x10));
          std::shared_ptr<cppnet::BufferBlock>::~shared_ptr
                    ((shared_ptr<cppnet::BufferBlock> *)(local_108 + 0x10));
          peVar6 = std::
                   __shared_ptr_access<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_70);
          local_80 = (*(peVar6->super_InnerBuffer).super_Buffer._vptr_Buffer[8])();
        }
      } while ((uint)local_a8._20_4_ <
               buffer_queue.super___shared_ptr<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._4_4_);
      uVar1 = local_a8._20_4_;
      this->_can_read_length = local_a8._20_4_ + this->_can_read_length;
      peVar5 = std::
               __shared_ptr_access<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&from_list._tail.
                              super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount);
      peVar5->_can_read_length = peVar5->_can_read_length - uVar1;
      this_local._4_4_ = local_a8._20_4_;
      std::shared_ptr<cppnet::BufferBlock>::~shared_ptr((shared_ptr<cppnet::BufferBlock> *)local_70)
      ;
      List<cppnet::BufferBlock>::~List
                ((List<cppnet::BufferBlock> *)
                 &from_buffer.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::shared_ptr<cppnet::BufferQueue>::~shared_ptr
                ((shared_ptr<cppnet::BufferQueue> *)
                 &from_list._tail.
                  super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    }
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

uint32_t BufferQueue::Write(std::shared_ptr<InnerBuffer> buffer, uint32_t len) {
    if (!buffer) {
        return 0;
    }
    
    if (len == 0) {
        len = buffer->GetCanReadLength();
    }
    if (len == 0) {
        return 0;
    }

    std::shared_ptr<BufferQueue> buffer_queue = std::dynamic_pointer_cast<BufferQueue>(buffer);
    auto from_list = buffer_queue->_buffer_list;
    auto from_buffer = from_list.GetHead();

    uint32_t should_write_size = from_list.GetHead()->GetCanReadLength();
    uint32_t total_write_len = 0;
    uint32_t cur_write_len = 0;

    while (1) {
        if (!_buffer_write) {
            Append();
            _buffer_write = _buffer_list.GetTail();
        }

        cur_write_len = _buffer_write->Write(from_buffer, should_write_size);
        total_write_len += cur_write_len;
        
        // current read block is empty
        if (cur_write_len >= should_write_size) {
            if (from_buffer == buffer_queue->_buffer_write) {
                if (buffer_queue->_buffer_write->GetNext()) {
                    buffer_queue->_buffer_write = buffer_queue->_buffer_write->GetNext();

                } else {
                    buffer_queue->Reset();
                    break;
                }
            }
            from_list.PopFront();
            from_buffer = from_list.GetHead();
            should_write_size = from_buffer->GetCanReadLength();

        // current write block is full
        } else {
            if (total_write_len >= len) {
                break;
            }
            should_write_size -= cur_write_len;
            _buffer_write = _buffer_write->GetNext();
        }

        if (total_write_len >= len) {
            break;
        }
    }
    _can_read_length += total_write_len;
    buffer_queue->_can_read_length -= total_write_len;
    return total_write_len;
}